

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::createColwise(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  int iVar1;
  const_reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsInt iToEl;
  HighsInt iCol_2;
  HighsInt iEl_1;
  HighsInt iRow_1;
  HighsInt iCol_1;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt iRow;
  vector<int,_std::allocator<int>_> a_end;
  vector<double,_std::allocator<double>_> *a_value;
  vector<int,_std::allocator<int>_> *a_index;
  vector<int,_std::allocator<int>_> *a_start;
  vector<double,_std::allocator<double>_> *ar_value;
  vector<int,_std::allocator<int>_> *ar_index;
  vector<int,_std::allocator<int>_> *ar_start;
  HighsInt num_nz;
  HighsInt num_row;
  HighsInt num_col;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar6;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  value_type vVar7;
  value_type in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  value_type in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int local_90;
  int local_8c;
  int local_88;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_68;
  pointer *local_50;
  pointer *local_48;
  pointer *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  HighsInt local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_14 = *(int *)(in_RSI + 4);
  local_18 = *(int *)(in_RSI + 8);
  local_10 = in_RSI;
  local_1c = numNz((HighsSparseMatrix *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_28 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x10);
  local_30 = (vector<int,_std::allocator<int>_> *)(local_10 + 0x40);
  local_38 = (vector<double,_std::allocator<double>_> *)(local_10 + 0x58);
  local_40 = &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_48 = &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_50 = &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7eac50);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff40,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
             ,(value_type_conflict2 *)0x7eac8a);
  for (local_7c = 0; local_7c < local_18; local_7c = local_7c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_7c);
    local_80 = *pvVar2;
    while( true ) {
      in_stack_ffffffffffffff5c = local_80;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)(local_7c + 1));
      if (*pvVar2 <= in_stack_ffffffffffffff5c) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_80);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)*pvVar2);
      *pvVar3 = *pvVar3 + 1;
      local_80 = local_80 + 1;
    }
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  *pvVar3 = 0;
  for (local_88 = 0; local_88 < local_14; local_88 = local_88 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)local_88);
    in_stack_ffffffffffffff50 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_88);
    in_stack_ffffffffffffff54 = in_stack_ffffffffffffff50 + *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)(local_88 + 1));
    *pvVar3 = in_stack_ffffffffffffff54;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)local_88);
    in_stack_ffffffffffffff58 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_88);
    *pvVar3 = in_stack_ffffffffffffff58;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<double,_std::allocator<double>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  for (local_8c = 0; local_8c < local_18; local_8c = local_8c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_8c);
    local_90 = *pvVar2;
    while( true ) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)(local_8c + 1));
      if (*pvVar2 <= local_90) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_90);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)*pvVar2);
      iVar1 = *pvVar3;
      *pvVar3 = iVar1 + 1;
      iVar6 = local_8c;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar1);
      *pvVar3 = iVar6;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_90);
      vVar7 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_50,(long)iVar1);
      *pvVar5 = vVar7;
      local_90 = local_90 + 1;
    }
  }
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = 1;
  *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + 4) = local_14;
  *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish = local_18;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void HighsSparseMatrix::createColwise(const HighsSparseMatrix& matrix) {
  assert(matrix.formatOk());
  assert(matrix.isRowwise());
  assert(this->formatOk());

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& ar_start = matrix.start_;
  const vector<HighsInt>& ar_index = matrix.index_;
  const vector<double>& ar_value = matrix.value_;
  vector<HighsInt>& a_start = this->start_;
  vector<HighsInt>& a_index = this->index_;
  vector<double>& a_value = this->value_;

  // Use a_end to compute lengths, which are then transformed into
  // the ends of the inserted entries
  std::vector<HighsInt> a_end;
  a_start.resize(num_col + 1);
  a_end.assign(num_col, 0);
  // Count the nonzeros in each col
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_end[iCol]++;
    }
  }
  // Compute the starts and turn the lengths into ends
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_end[iCol];
    a_end[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  // Insert the entries
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      HighsInt iToEl = a_end[iCol]++;
      a_index[iToEl] = iRow;
      a_value[iToEl] = ar_value[iEl];
    }
  }
  this->format_ = MatrixFormat::kColwise;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}